

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O2

int __thiscall InvertDatabase::make_l2_pass(InvertDatabase *this)

{
  int iVar1;
  ulong uVar2;
  element_type *peVar3;
  int p;
  int iVar4;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  *pvVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int l2cnt;
  int local_54 [3];
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  *local_48;
  long local_40;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  *local_38;
  
  local_54[0] = 0;
  iVar1 = ClassInfo::get_num_class
                    ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_38 = &this->set_sup;
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(local_38,(long)this->numfreq);
  local_48 = &this->seq_sup;
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(local_48,(long)this->numfreq);
  lVar8 = 0;
  while( true ) {
    uVar2 = (ulong)(uint)this->numfreq;
    if (this->numfreq <= (int)lVar8) break;
    lVar8 = (long)(int)lVar8;
    pvVar5 = local_48;
    while (iVar4 = (int)uVar2, lVar8 < iVar4) {
      peVar3 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_40 = lVar8;
      if (((int)((uint)lVar8 - iVar4) < -1) && (1 < peVar3->max_iset_len)) {
        uVar7 = ~(uint)lVar8;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize((local_38->
                 super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar8,(long)(int)(iVar4 + uVar7));
        lVar9 = 0;
        for (lVar6 = 0; uVar2 = (ulong)(uint)this->numfreq, lVar6 < (int)(this->numfreq + uVar7);
            lVar6 = lVar6 + 1) {
          local_54[2] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (*(long *)&(local_38->
                                super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar8].
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar9),(long)iVar1,
                     (value_type_conflict4 *)(local_54 + 2));
          lVar9 = lVar9 + 0x18;
        }
        peVar3 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pvVar5 = local_48;
      }
      lVar8 = local_40;
      if (1 < peVar3->max_seq_len) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize((pvVar5->
                 super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_40,(long)(int)uVar2);
        lVar9 = 0;
        for (lVar6 = 0; uVar2 = (ulong)this->numfreq, lVar6 < (long)uVar2; lVar6 = lVar6 + 1) {
          local_54[1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (*(long *)&(pvVar5->
                                super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar8].
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar9),(long)iVar1,
                     (value_type_conflict4 *)(local_54 + 1));
          lVar9 = lVar9 + 0x18;
        }
      }
      lVar8 = local_40 + 1;
    }
    for (iVar4 = 0;
        iVar4 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->num_partitions; iVar4 = iVar4 + 1) {
      process_invert(this,iVar4);
    }
    get_F2(this,local_54);
  }
  return local_54[0];
}

Assistant:

int InvertDatabase::make_l2_pass() {
    int i, j;

    int l2cnt = 0;
    int num_class = cls->get_num_class();

    // support for 2-itemsets
    set_sup.resize(numfreq);
    seq_sup.resize(numfreq);

    int low, high;

    for (low = 0; low < numfreq; low = high) {
        for (high = low; high < numfreq; high++) {
            if (args->max_iset_len > 1 && numfreq - high - 1 > 0) {
                set_sup[high].resize(numfreq - high - 1);
                for (i = 0; i < numfreq - high - 1; i++) {
                    set_sup[high][i].resize(num_class, 0);
                }
            }
            if (args->max_seq_len > 1) {
                seq_sup[high].resize(numfreq);
                for (i = 0; i < numfreq; i++) {
                    seq_sup[high][i].resize(num_class, 0);
                }
            }
        }
        for (int p = 0; p < args->num_partitions; p++) {
            process_invert(p);
        }
        get_F2(l2cnt);
    }

    return l2cnt;
}